

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O0

void __thiscall crnlib::qdxt1::pack_endpoints_task(qdxt1 *this,uint64 data,void *param_2)

{
  bool bVar1;
  uint16 color0;
  uint16 color1;
  uint uVar2;
  uint32 uVar3;
  uint uVar4;
  crn_thread_id_t cVar5;
  vector<unsigned_int> *this_00;
  value_type *pvVar6;
  uint *puVar7;
  color_quad<unsigned_char,_int> *pcVar8;
  uchar *pSelectors;
  dxt1_block *this_01;
  color_quad<unsigned_char,_int> *local_c10;
  insert_result local_ba8;
  uint local_b8c;
  scoped_spinlock local_b88;
  scoped_spinlock lock_1;
  int i_3;
  uint mask_1;
  dxt1_block *dxt_block_1;
  uint block_index_2;
  uint block_iter_2;
  uint8 *pSrc_selectors;
  uint high_color_1;
  uint low_color_1;
  color_quad_u8 *src;
  dxt_pixel_block *pdStack_b48;
  uint i_2;
  color_quad_u8 *pSrc_pixels_1;
  uint local_b38;
  uint block_index_1;
  uint block_iter_1;
  bool has_alpha_pixels;
  color_quad_u8 *pDst;
  uint dist3;
  uint best_dist;
  uint selector;
  uint dist2;
  uint dist1;
  uint dist0;
  color_quad_u8 *c;
  int i_1;
  uint mask;
  dxt1_block *dxt_block;
  dxt_pixel_block *pdStack_af0;
  uint i;
  color_quad_u8 *pSrc_pixels;
  uint local_ae0;
  uint block_index;
  uint block_iter;
  bool is_alpha_block;
  color_quad_u8 block_colors [4];
  undefined1 local_ab8 [4];
  uint16 high_color;
  uint16 low_color;
  undefined1 local_aa8 [24];
  const_iterator it;
  scoped_spinlock lock;
  uint32 found_endpoints;
  bool found;
  vector<unsigned_int> *cluster_indices;
  uint cluster_index;
  vector<unsigned_int> *indices;
  cluster_id cid;
  undefined1 local_a40 [4];
  uint cluster_index_progress_mask;
  results r;
  params p;
  dxt1_endpoint_optimizer optimizer;
  vector<unsigned_char> selectors;
  undefined1 local_38 [8];
  vector<crnlib::color_quad<unsigned_char,_int>_> cluster_pixels;
  uint thread_index;
  void *param_2_local;
  uint64 data_local;
  qdxt1 *this_local;
  
  param_2_local._0_4_ = (uint)data;
  cluster_pixels.m_capacity = (uint)param_2_local;
  vector<crnlib::color_quad<unsigned_char,_int>_>::vector
            ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_38);
  vector<crnlib::color_quad<unsigned_char,_int>_>::reserve
            ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_38,0x400);
  vector<unsigned_char>::vector((vector<unsigned_char> *)&optimizer.m_solutions_tried.m_num_valid);
  vector<unsigned_char>::reserve
            ((vector<unsigned_char> *)&optimizer.m_solutions_tried.m_num_valid,0x400);
  dxt1_endpoint_optimizer::dxt1_endpoint_optimizer((dxt1_endpoint_optimizer *)&p.m_endpoint_caching)
  ;
  dxt1_endpoint_optimizer::params::params((params *)&r.m_alpha_block);
  dxt1_endpoint_optimizer::results::results((results *)local_a40);
  p.m_num_pixels = (this->m_params).m_dxt_quality;
  p.m_dxt1a_alpha_threshold._1_1_ = (this->m_params).m_use_alpha_blocks & 1;
  p.m_pPixels._4_4_ = (this->m_params).m_dxt1a_alpha_threshold;
  p.m_dxt1a_alpha_threshold._2_1_ = (this->m_params).m_perceptual & 1;
  uVar2 = vector<crnlib::vector<unsigned_int>_>::size(&this->m_endpoint_cluster_indices);
  uVar3 = math::next_pow2(uVar2 / 100);
  cid.m_hash._4_4_ = uVar3 >> 1;
  uVar4 = math::maximum<unsigned_int>(cid.m_hash._4_4_,8);
  cid.m_hash._4_4_ = uVar4 - 1;
  cluster_id::cluster_id((cluster_id *)&indices);
  cluster_indices._4_4_ = 0;
  while ((uVar2 = vector<crnlib::vector<unsigned_int>_>::size(&this->m_endpoint_cluster_indices),
         cluster_indices._4_4_ < uVar2 && ((this->m_canceled & 1U) == 0))) {
    if (((cluster_indices._4_4_ & cid.m_hash._4_4_) == 0) &&
       (cVar5 = crn_get_current_thread_id(), cVar5 == this->m_main_thread_id)) {
      uVar2 = vector<crnlib::vector<unsigned_int>_>::size(&this->m_endpoint_cluster_indices);
      bVar1 = update_progress(this,cluster_indices._4_4_,uVar2 - 1);
      if (!bVar1) break;
    }
    uVar2 = task_pool::get_num_threads(this->m_pTask_pool);
    if ((uVar2 == 0) ||
       (uVar2 = task_pool::get_num_threads(this->m_pTask_pool),
       cluster_indices._4_4_ % (uVar2 + 1) == cluster_pixels.m_capacity)) {
      this_00 = vector<crnlib::vector<unsigned_int>_>::operator[]
                          (&this->m_endpoint_cluster_indices,cluster_indices._4_4_);
      uVar2 = vector<unsigned_int>::size(this_00);
      vector<unsigned_char>::resize
                ((vector<unsigned_char> *)&optimizer.m_solutions_tried.m_num_valid,uVar2 << 4,false)
      ;
      lock.m_lock._0_4_ = 0;
      cluster_id::set((cluster_id *)&indices,this_00);
      scoped_spinlock::scoped_spinlock((scoped_spinlock *)&it.m_index,&this->m_cluster_hash_lock);
      hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
      ::find((hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
              *)local_aa8,(cluster_id *)&this->m_cluster_hash);
      hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
      ::const_iterator::const_iterator((const_iterator *)(local_aa8 + 0x10),(iterator *)local_aa8);
      hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
      ::end((hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
             *)local_ab8);
      bVar1 = hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
              ::const_iterator::operator!=
                        ((const_iterator *)(local_aa8 + 0x10),(iterator *)local_ab8);
      if (bVar1) {
        pvVar6 = hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
                 ::const_iterator::operator->((const_iterator *)(local_aa8 + 0x10));
        lock.m_lock._0_4_ = pvVar6->second;
      }
      scoped_spinlock::~scoped_spinlock((scoped_spinlock *)&it.m_index);
      if (bVar1) {
        color0 = (uint16)(uint)lock.m_lock;
        color1 = (uint16)((uint)lock.m_lock >> 0x10);
        local_c10 = (color_quad<unsigned_char,_int> *)&block_iter;
        do {
          color_quad<unsigned_char,_int>::color_quad(local_c10);
          local_c10 = local_c10 + 1;
        } while (local_c10 != block_colors + 2);
        dxt1_block::get_block_colors((color_quad_u8 *)&block_iter,color0,color1);
        block_index._3_1_ = color0 <= color1;
        for (local_ae0 = 0; uVar4 = local_ae0,
            uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)&indices), uVar4 < uVar2;
            local_ae0 = local_ae0 + 1) {
          puVar7 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&indices,local_ae0);
          pSrc_pixels._4_4_ = *puVar7;
          pdStack_af0 = this->m_pBlocks + pSrc_pixels._4_4_;
          for (dxt_block._4_4_ = 0; dxt_block._4_4_ < 0x10; dxt_block._4_4_ = dxt_block._4_4_ + 1) {
            _i_1 = get_block(this,pSrc_pixels._4_4_);
            dxt1_block::set_low_color(_i_1,color0);
            dxt1_block::set_high_color(_i_1,color1);
            c._4_4_ = 0;
            for (c._0_4_ = 0xf; -1 < (int)c; c._0_4_ = (int)c + -1) {
              c._4_4_ = c._4_4_ << 2;
              _dist1 = pdStack_af0->m_pixels[0] + (int)c;
              dist2 = crnlib::color::color_distance
                                ((bool)((this->m_params).m_perceptual & 1),_dist1,
                                 (color_quad_u8 *)&block_iter,false);
              selector = crnlib::color::color_distance
                                   ((bool)((this->m_params).m_perceptual & 1),_dist1,
                                    (color_quad_u8 *)&stack0xfffffffffffff52c,false);
              best_dist = crnlib::color::color_distance
                                    ((bool)((this->m_params).m_perceptual & 1),_dist1,block_colors,
                                     false);
              pDst._4_4_ = dist2;
              if (selector < dist2) {
                pDst._4_4_ = selector;
              }
              dist3 = (uint)(selector < dist2);
              if (best_dist < pDst._4_4_) {
                dist3 = 2;
                pDst._4_4_ = best_dist;
              }
              if ((block_index._3_1_ & 1) == 0) {
                pDst._0_4_ = crnlib::color::color_distance
                                       ((bool)((this->m_params).m_perceptual & 1),_dist1,
                                        block_colors + 1,false);
                if ((uint)pDst < pDst._4_4_) {
                  dist3 = 3;
                }
              }
              else if ((uint)(_dist1->field_0).field_0.a < (this->m_params).m_dxt1a_alpha_threshold)
              {
                dist3 = 3;
              }
              c._4_4_ = dist3 | c._4_4_;
            }
            _i_1->m_selectors[0] = (uint8)c._4_4_;
            _i_1->m_selectors[1] = (uint8)(c._4_4_ >> 8);
            _i_1->m_selectors[2] = (uint8)(c._4_4_ >> 0x10);
            _i_1->m_selectors[3] = (uint8)(c._4_4_ >> 0x18);
          }
        }
      }
      else {
        uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)&indices);
        vector<crnlib::color_quad<unsigned_char,_int>_>::resize
                  ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_38,uVar2 << 4,false);
        _block_iter_1 =
             vector<crnlib::color_quad<unsigned_char,_int>_>::operator[]
                       ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_38,0);
        block_index_1._3_1_ = 0;
        for (local_b38 = 0; uVar4 = local_b38,
            uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)&indices), uVar4 < uVar2;
            local_b38 = local_b38 + 1) {
          puVar7 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&indices,local_b38);
          pSrc_pixels_1._4_4_ = *puVar7;
          pdStack_b48 = this->m_pBlocks + pSrc_pixels_1._4_4_;
          for (src._4_4_ = 0; pcVar8 = _block_iter_1, src._4_4_ < 0x10; src._4_4_ = src._4_4_ + 1) {
            _high_color_1 = pdStack_b48->m_pixels[0] + src._4_4_;
            if ((uint)(_high_color_1->field_0).field_0.a < (this->m_params).m_dxt1a_alpha_threshold)
            {
              block_index_1._3_1_ = 1;
            }
            _block_iter_1 = _block_iter_1 + 1;
            color_quad<unsigned_char,_int>::operator=(pcVar8,_high_color_1);
          }
        }
        r.m_alpha_block = (bool)cluster_indices._4_1_;
        r.m_reordered = (bool)cluster_indices._5_1_;
        r.m_alternate_rounding = (bool)cluster_indices._6_1_;
        r.m_enforce_selector = (bool)cluster_indices._7_1_;
        p.m_pPixels._0_4_ =
             vector<crnlib::color_quad<unsigned_char,_int>_>::size
                       ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_38);
        p._0_8_ = vector<crnlib::color_quad<unsigned_char,_int>_>::begin
                            ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_38);
        r._8_8_ = vector<unsigned_char>::begin
                            ((vector<unsigned_char> *)&optimizer.m_solutions_tried.m_num_valid);
        if (((this->m_params).m_dxt_quality == cCRNDXTQualitySuperFast) &&
           ((block_index_1._3_1_ & 1) == 0)) {
          uVar2 = vector<crnlib::color_quad<unsigned_char,_int>_>::size
                            ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_38);
          pcVar8 = vector<crnlib::color_quad<unsigned_char,_int>_>::begin
                             ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_38);
          pSelectors = vector<unsigned_char>::begin
                                 ((vector<unsigned_char> *)&optimizer.m_solutions_tried.m_num_valid)
          ;
          dxt_fast::compress_color_block
                    (uVar2,pcVar8,(uint *)((long)&pSrc_selectors + 4),(uint *)&pSrc_selectors,
                     pSelectors,true);
        }
        else {
          p.m_dxt1a_alpha_threshold._0_1_ = block_index_1._3_1_ & 1;
          dxt1_endpoint_optimizer::compute
                    ((dxt1_endpoint_optimizer *)&p.m_endpoint_caching,(params *)&r.m_alpha_block,
                     (results *)local_a40);
          pSrc_selectors._4_4_ = (uint)(ushort)r.m_error;
          pSrc_selectors._0_4_ = (uint)r.m_error._2_2_;
        }
        _block_index_2 =
             vector<unsigned_char>::begin
                       ((vector<unsigned_char> *)&optimizer.m_solutions_tried.m_num_valid);
        for (dxt_block_1._4_4_ = 0;
            uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)&indices),
            dxt_block_1._4_4_ < uVar2; dxt_block_1._4_4_ = dxt_block_1._4_4_ + 1) {
          puVar7 = vector<unsigned_int>::operator[]
                             ((vector<unsigned_int> *)&indices,dxt_block_1._4_4_);
          this_01 = get_block(this,*puVar7);
          dxt1_block::set_low_color(this_01,pSrc_selectors._4_2_);
          dxt1_block::set_high_color(this_01,(uint16)pSrc_selectors);
          lock_1.m_lock._4_4_ = 0;
          for (lock_1.m_lock._0_4_ = 0xf; -1 < (int)lock_1.m_lock;
              lock_1.m_lock._0_4_ = (int)lock_1.m_lock + -1) {
            lock_1.m_lock._4_4_ =
                 (uint)_block_index_2[(int)lock_1.m_lock] | lock_1.m_lock._4_4_ << 2;
          }
          _block_index_2 = _block_index_2 + 0x10;
          this_01->m_selectors[0] = (uint8)lock_1.m_lock._4_4_;
          this_01->m_selectors[1] = (uint8)(lock_1.m_lock._4_4_ >> 8);
          this_01->m_selectors[2] = (uint8)(lock_1.m_lock._4_4_ >> 0x10);
          this_01->m_selectors[3] = (uint8)(lock_1.m_lock._4_4_ >> 0x18);
        }
        scoped_spinlock::scoped_spinlock(&local_b88,&this->m_cluster_hash_lock);
        local_b8c = pSrc_selectors._4_4_ | (uint)pSrc_selectors << 0x10;
        hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
        ::insert(&local_ba8,&this->m_cluster_hash,(cluster_id *)&indices,&local_b8c);
        scoped_spinlock::~scoped_spinlock(&local_b88);
      }
    }
    cluster_indices._4_4_ = cluster_indices._4_4_ + 1;
  }
  cluster_id::~cluster_id((cluster_id *)&indices);
  dxt1_endpoint_optimizer::~dxt1_endpoint_optimizer
            ((dxt1_endpoint_optimizer *)&p.m_endpoint_caching);
  vector<unsigned_char>::~vector((vector<unsigned_char> *)&optimizer.m_solutions_tried.m_num_valid);
  vector<crnlib::color_quad<unsigned_char,_int>_>::~vector
            ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_38);
  return;
}

Assistant:

void qdxt1::pack_endpoints_task(uint64 data, void*)
    {
        const uint thread_index = static_cast<uint>(data);

        crnlib::vector<color_quad_u8> cluster_pixels;
        cluster_pixels.reserve(1024);

        crnlib::vector<uint8> selectors;
        selectors.reserve(1024);

        dxt1_endpoint_optimizer optimizer;
        dxt1_endpoint_optimizer::params p;
        dxt1_endpoint_optimizer::results r;

        p.m_quality = m_params.m_dxt_quality;
        p.m_use_alpha_blocks = m_params.m_use_alpha_blocks;
        p.m_dxt1a_alpha_threshold = m_params.m_dxt1a_alpha_threshold;
        p.m_perceptual = m_params.m_perceptual;

        uint cluster_index_progress_mask = math::next_pow2(m_endpoint_cluster_indices.size() / 100);
        cluster_index_progress_mask /= 2;
        cluster_index_progress_mask = math::maximum<uint>(cluster_index_progress_mask, 8);
        cluster_index_progress_mask -= 1;

        cluster_id cid;
        const crnlib::vector<uint32>& indices = cid.m_cells;

        for (uint cluster_index = 0; cluster_index < m_endpoint_cluster_indices.size(); cluster_index++)
        {
            if (m_canceled)
            {
                return;
            }

            if ((cluster_index & cluster_index_progress_mask) == 0)
            {
                if (crn_get_current_thread_id() == m_main_thread_id)
                {
                    if (!update_progress(cluster_index, m_endpoint_cluster_indices.size() - 1))
                    {
                        return;
                    }
                }
            }

            if (m_pTask_pool->get_num_threads())
            {
                if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const crnlib::vector<uint>& cluster_indices = m_endpoint_cluster_indices[cluster_index];

            selectors.resize(cluster_indices.size() * cDXTBlockSize * cDXTBlockSize);

            bool found = false;
            uint32 found_endpoints = 0;

            cid.set(cluster_indices);

            {
                scoped_spinlock lock(m_cluster_hash_lock);

                cluster_hash::const_iterator it(m_cluster_hash.find(cid));
                if (it != m_cluster_hash.end())
                {
                    CRNLIB_ASSERT(cid == it->first);

                    found = true;
                    found_endpoints = it->second;
                }
            }

            if (found)
            {
                const uint16 low_color = static_cast<uint16>(found_endpoints);
                const uint16 high_color = static_cast<uint16>((found_endpoints >> 16U));

                color_quad_u8 block_colors[4];
                dxt1_block::get_block_colors(block_colors, low_color, high_color);

                const bool is_alpha_block = (low_color <= high_color);

                for (uint block_iter = 0; block_iter < indices.size(); block_iter++)
                {
                    const uint block_index = indices[block_iter];

                    const color_quad_u8* pSrc_pixels = &m_pBlocks[block_index].m_pixels[0][0];

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        dxt1_block& dxt_block = get_block(block_index);

                        dxt_block.set_low_color(static_cast<uint16>(low_color));
                        dxt_block.set_high_color(static_cast<uint16>(high_color));

                        uint mask = 0;
                        for (int i = 15; i >= 0; i--)
                        {
                            mask <<= 2;

                            const color_quad_u8& c = pSrc_pixels[i];

                            uint dist0 = color::color_distance(m_params.m_perceptual, c, block_colors[0], false);
                            uint dist1 = color::color_distance(m_params.m_perceptual, c, block_colors[1], false);
                            uint dist2 = color::color_distance(m_params.m_perceptual, c, block_colors[2], false);

                            uint selector = 0, best_dist = dist0;

                            if (dist1 < best_dist)
                            {
                                selector = 1;
                                best_dist = dist1;
                            }
                            if (dist2 < best_dist)
                            {
                                selector = 2;
                                best_dist = dist2;
                            }

                            if (!is_alpha_block)
                            {
                                uint dist3 = color::color_distance(m_params.m_perceptual, c, block_colors[3], false);
                                if (dist3 < best_dist)
                                {
                                    selector = 3;
                                }
                            }
                            else
                            {
                                if (c.a < m_params.m_dxt1a_alpha_threshold)
                                {
                                    selector = 3;
                                }
                            }

                            mask |= selector;
                        }

                        dxt_block.m_selectors[0] = static_cast<uint8>(mask & 0xFF);
                        dxt_block.m_selectors[1] = static_cast<uint8>((mask >> 8) & 0xFF);
                        dxt_block.m_selectors[2] = static_cast<uint8>((mask >> 16) & 0xFF);
                        dxt_block.m_selectors[3] = static_cast<uint8>((mask >> 24) & 0xFF);
                    }
                }
            }
            else
            {
                cluster_pixels.resize(indices.size() * cDXTBlockSize * cDXTBlockSize);

                color_quad_u8* pDst = &cluster_pixels[0];

                bool has_alpha_pixels = false;

                for (uint block_iter = 0; block_iter < indices.size(); block_iter++)
                {
                    const uint block_index = indices[block_iter];

                    //const color_quad_u8* pSrc_pixels = &m_pBlocks[block_index].m_pixels[0][0];
                    const color_quad_u8* pSrc_pixels = (const color_quad_u8*)m_pBlocks[block_index].m_pixels;

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        const color_quad_u8& src = pSrc_pixels[i];

                        if (src.a < m_params.m_dxt1a_alpha_threshold)
                        {
                            has_alpha_pixels = true;
                        }

                        *pDst++ = src;
                    }
                }

                p.m_block_index = cluster_index;
                p.m_num_pixels = cluster_pixels.size();
                p.m_pPixels = cluster_pixels.begin();

                r.m_pSelectors = selectors.begin();

                uint low_color, high_color;
                if ((m_params.m_dxt_quality != cCRNDXTQualitySuperFast) || (has_alpha_pixels))
                {
                    p.m_pixels_have_alpha = has_alpha_pixels;

                    optimizer.compute(p, r);
                    low_color = r.m_low_color;
                    high_color = r.m_high_color;
                }
                else
                {
                    dxt_fast::compress_color_block(cluster_pixels.size(), cluster_pixels.begin(), low_color, high_color, selectors.begin(), true);
                }

                const uint8* pSrc_selectors = selectors.begin();

                for (uint block_iter = 0; block_iter < indices.size(); block_iter++)
                {
                    const uint block_index = indices[block_iter];

                    dxt1_block& dxt_block = get_block(block_index);

                    dxt_block.set_low_color(static_cast<uint16>(low_color));
                    dxt_block.set_high_color(static_cast<uint16>(high_color));

                    uint mask = 0;
                    for (int i = 15; i >= 0; i--)
                    {
                        mask <<= 2;
                        mask |= pSrc_selectors[i];
                    }
                    pSrc_selectors += (cDXTBlockSize * cDXTBlockSize);

                    dxt_block.m_selectors[0] = static_cast<uint8>(mask & 0xFF);
                    dxt_block.m_selectors[1] = static_cast<uint8>((mask >> 8) & 0xFF);
                    dxt_block.m_selectors[2] = static_cast<uint8>((mask >> 16) & 0xFF);
                    dxt_block.m_selectors[3] = static_cast<uint8>((mask >> 24) & 0xFF);
                }

                {
                    scoped_spinlock lock(m_cluster_hash_lock);

                    m_cluster_hash.insert(cid, low_color | (high_color << 16));
                }
            }
        }
    }